

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

bool __thiscall sznet::net::EventLoop::hasChannel(EventLoop *this,Channel *channel)

{
  Poller *pPVar1;
  int iVar2;
  
  if (channel->m_loop == this) {
    assertInLoopThread(this);
    pPVar1 = (this->m_poller)._M_t.
             super___uniq_ptr_impl<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>.
             _M_t.
             super__Tuple_impl<0UL,_sznet::net::Poller_*,_std::default_delete<sznet::net::Poller>_>.
             super__Head_base<0UL,_sznet::net::Poller_*,_false>._M_head_impl;
    iVar2 = (*pPVar1->_vptr_Poller[5])(pPVar1,channel);
    return SUB41(iVar2,0);
  }
  __assert_fail("channel->ownerLoop() == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                ,0xdb,"bool sznet::net::EventLoop::hasChannel(Channel *)");
}

Assistant:

bool EventLoop::hasChannel(Channel* channel)
{
	assert(channel->ownerLoop() == this);
	assertInLoopThread();
	return m_poller->hasChannel(channel);
}